

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O1

void __thiscall VM_Writer::write_if(VM_Writer *this,int label_number)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  ostream *poVar4;
  uint uVar5;
  long *plVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  string __str;
  long *local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  __val = -label_number;
  if (0 < label_number) {
    __val = label_number;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_001323b0;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_001323b0;
      }
      if (uVar5 < 10000) goto LAB_001323b0;
      uVar7 = uVar7 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_001323b0:
  poVar4 = (ostream *)this->out_file;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(label_number >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)label_number >> 0x1f) + (long)local_50[0]),__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x134729);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar3;
  }
  lVar1 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_70,lVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void VM_Writer::write_if(int label_number) {
    out_file << "if-goto L" + std::to_string(label_number) << std::endl;
}